

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O0

bool __thiscall CDirectiveFunction::Validate(CDirectiveFunction *this,ValidateState *state)

{
  int iVar1;
  uint uVar2;
  int64_t iVar3;
  pointer pCVar4;
  pointer pCVar5;
  undefined1 local_38;
  undefined7 uStack_37;
  ValidateState contentValidation;
  bool result;
  ValidateState *state_local;
  CDirectiveFunction *this_local;
  
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->start = iVar3;
  pCVar4 = std::unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>::operator->
                     (&this->label);
  CAssemblerCommand::applyFileInfo(&pCVar4->super_CAssemblerCommand);
  pCVar4 = std::unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>::operator->
                     (&this->label);
  iVar1 = (*(pCVar4->super_CAssemblerCommand)._vptr_CAssemblerCommand[2])(pCVar4,state);
  contentValidation._23_1_ = (byte)iVar1 & 1;
  contentValidation.noFileChangeDirective = *(char **)&state->passes;
  _local_38 = CONCAT71((int7)((ulong)*(undefined8 *)state >> 8),1);
  contentValidation._0_8_ = (long)"Not inside a function" + 0xd;
  pCVar5 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  CAssemblerCommand::applyFileInfo(pCVar5);
  pCVar5 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  uVar2 = (*pCVar5->_vptr_CAssemblerCommand[2])(pCVar5,&local_38);
  if ((uVar2 & 1) != 0) {
    contentValidation._23_1_ = 1;
  }
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->end = iVar3;
  return (bool)(contentValidation._23_1_ & 1);
}

Assistant:

bool CDirectiveFunction::Validate(const ValidateState &state)
{
	start = g_fileManager->getVirtualAddress();

	label->applyFileInfo();
	bool result = label->Validate(state);

	ValidateState contentValidation = state;
	contentValidation.noFileChange = true;
	contentValidation.noFileChangeDirective = "function";
	content->applyFileInfo();
	if (content->Validate(contentValidation))
		result = true;

	end = g_fileManager->getVirtualAddress();
	return result;
}